

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

int is_swizzle_str(char *str,int veclen)

{
  char cVar1;
  int local_28;
  int iStack_24;
  char ch;
  int is_rgba;
  int is_xyzw;
  int i;
  int veclen_local;
  char *str_local;
  
  iStack_24 = 0;
  local_28 = 0;
  if (*str != '\0') {
    is_rgba = 0;
    for (_i = str; (is_rgba < veclen && (cVar1 = *_i, cVar1 != '\0')); _i = _i + 1) {
      if ((((cVar1 == 'x') || (cVar1 == 'y')) || (cVar1 == 'z')) || (cVar1 == 'w')) {
        iStack_24 = 1;
      }
      else if (((cVar1 == 'r') || (cVar1 == 'g')) || ((cVar1 == 'b' || (cVar1 == 'a')))) {
        local_28 = 1;
      }
      is_rgba = is_rgba + 1;
    }
    if (*_i == '\0') {
      str_local._4_4_ = (uint)(local_28 + iStack_24 == 1);
    }
    else {
      str_local._4_4_ = 0;
    }
    return str_local._4_4_;
  }
  __assert_fail("*str != \'\\0\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0x8c6,"int is_swizzle_str(const char *, const int)");
}

Assistant:

static int is_swizzle_str(const char *str, const int veclen)
{
    int i;
    int is_xyzw = 0;
    int is_rgba = 0;

    assert(*str != '\0');  // can this actually happen?

    for (i = 0; i < veclen; i++, str++)
    {
        const char ch = *str;
        if (ch == '\0')
            break;
        else if ((ch == 'x') || (ch == 'y') || (ch == 'z') || (ch == 'w'))
            is_xyzw = 1;
        else if ((ch == 'r') || (ch == 'g') || (ch == 'b') || (ch == 'a'))
            is_rgba = 1;
    } // for

    if (*str != '\0')  // must be end of string here.
        return 0;  // not a swizzle.
    return ((is_rgba + is_xyzw) == 1);  // can only be one or the other.
}